

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::UtilsTest_HexEncodingDecoding_DecodingHexStringWithOddLengthShouldFail_Test::
TestBody(UtilsTest_HexEncodingDecoding_DecodingHexStringWithOddLengthShouldFail_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  ByteArray buf;
  internal local_88 [8];
  undefined8 *local_80;
  string local_78;
  ErrorCode local_54;
  Error local_50;
  ByteArray local_28;
  
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"00010","");
  utils::Hex(&local_50,&local_28,&local_78);
  local_54 = kInvalidArgs;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            (local_88,"utils::Hex(buf, \"00010\")","ErrorCode::kInvalidArgs",&local_50,&local_54);
  if (local_50.mMessage._M_dataplus._M_p != (pointer)((long)&local_50 + 0x18U)) {
    operator_delete(local_50.mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_80 == (undefined8 *)0x0) {
      message = anon_var_dwarf_434f87 + 9;
    }
    else {
      message = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
               ,0x6f,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_50._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
  }
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(local_80);
  }
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(UtilsTest, HexEncodingDecoding_EmptyStringDecodedIntoEmptyByteArray)
{
    ByteArray   buf;
    std::string hexStr;

    EXPECT_EQ(utils::Hex(buf, hexStr), ErrorCode::kNone);
    EXPECT_TRUE(buf.empty());
}